

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O1

void __thiscall zmq::ctx_t::~ctx_t(ctx_t *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppiVar2;
  pointer ppiVar3;
  io_thread_t *this_00;
  reaper_t *this_01;
  pointer ppiVar4;
  pointer puVar5;
  pointer ppsVar6;
  pointer pcVar7;
  long lVar8;
  long lVar9;
  
  if ((this->_sockets)._items.
      super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->_sockets)._items.
      super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_sockets.empty ()",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ctx.cpp"
            ,0x74);
    fflush(_stderr);
    zmq_abort("_sockets.empty ()");
  }
  ppiVar2 = (this->_io_threads).
            super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppiVar3 = (this->_io_threads).
            super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar9 = (long)ppiVar3 - (long)ppiVar2 >> 3;
  if (ppiVar3 != ppiVar2) {
    lVar8 = 0;
    do {
      io_thread_t::stop((this->_io_threads).
                        super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  if (ppiVar3 != ppiVar2) {
    lVar8 = 0;
    do {
      this_00 = (this->_io_threads).
                super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8];
      if (this_00 != (io_thread_t *)0x0) {
        io_thread_t::~io_thread_t(this_00);
        operator_delete(this_00,0xe0);
      }
      (this->_io_threads).
      super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8] = (io_thread_t *)0x0;
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  this_01 = this->_reaper;
  if (this_01 != (reaper_t *)0x0) {
    reaper_t::~reaper_t(this_01);
    operator_delete(this_01,0xf0);
  }
  this->_reaper = (reaper_t *)0x0;
  random_close();
  this->_tag = 0xdeadbeef;
  mutex_t::~mutex_t(&this->_endpoints_sync);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::ctx_t::pending_connection_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::ctx_t::pending_connection_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::ctx_t::pending_connection_t>_>_>
  ::~_Rb_tree(&(this->_pending_connections)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
  ::~_Rb_tree(&(this->_endpoints)._M_t);
  mailbox_t::~mailbox_t(&this->_term_mailbox);
  ppiVar4 = (this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppiVar4 != (pointer)0x0) {
    operator_delete(ppiVar4,(long)(this->_slots).
                                  super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppiVar4
                   );
  }
  ppiVar2 = (this->_io_threads).
            super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppiVar2 != (pointer)0x0) {
    operator_delete(ppiVar2,(long)(this->_io_threads).
                                  super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppiVar2
                   );
  }
  mutex_t::~mutex_t(&this->_slot_sync);
  puVar5 = (this->_empty_slots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->_empty_slots).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  ppsVar6 = (this->_sockets)._items.
            super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppsVar6 != (pointer)0x0) {
    operator_delete(ppsVar6,(long)(this->_sockets)._items.
                                  super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppsVar6
                   );
  }
  pcVar7 = (this->super_thread_ctx_t)._thread_name_prefix._M_dataplus._M_p;
  paVar1 = &(this->super_thread_ctx_t)._thread_name_prefix.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar7 != paVar1) {
    operator_delete(pcVar7,paVar1->_M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->super_thread_ctx_t)._thread_affinity_cpus._M_t);
  mutex_t::~mutex_t((mutex_t *)this);
  return;
}

Assistant:

zmq::ctx_t::~ctx_t ()
{
    //  Check that there are no remaining _sockets.
    zmq_assert (_sockets.empty ());

    //  Ask I/O threads to terminate. If stop signal wasn't sent to I/O
    //  thread subsequent invocation of destructor would hang-up.
    const io_threads_t::size_type io_threads_size = _io_threads.size ();
    for (io_threads_t::size_type i = 0; i != io_threads_size; i++) {
        _io_threads[i]->stop ();
    }

    //  Wait till I/O threads actually terminate.
    for (io_threads_t::size_type i = 0; i != io_threads_size; i++) {
        LIBZMQ_DELETE (_io_threads[i]);
    }

    //  Deallocate the reaper thread object.
    LIBZMQ_DELETE (_reaper);

    //  The mailboxes in _slots themselves were deallocated with their
    //  corresponding io_thread/socket objects.

    //  De-initialise crypto library, if needed.
    zmq::random_close ();

#ifdef ZMQ_USE_NSS
    NSS_Shutdown ();
#endif

#ifdef ZMQ_USE_GNUTLS
    gnutls_global_deinit ();
#endif

    //  Remove the tag, so that the object is considered dead.
    _tag = ZMQ_CTX_TAG_VALUE_BAD;
}